

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

TResourceType __thiscall
glslang::TDefaultIoResolver::getResourceType(TDefaultIoResolver *this,TType *type)

{
  bool bVar1;
  TType *type_local;
  TDefaultIoResolver *this_local;
  
  bVar1 = TDefaultIoResolverBase::isImageType(type);
  if (bVar1) {
    this_local._4_4_ = EResImage;
  }
  else {
    bVar1 = TDefaultIoResolverBase::isTextureType(type);
    if (bVar1) {
      this_local._4_4_ = EResTexture;
    }
    else {
      bVar1 = TDefaultIoResolverBase::isSsboType(type);
      if (bVar1) {
        this_local._4_4_ = EResSsbo;
      }
      else {
        bVar1 = TDefaultIoResolverBase::isSamplerType(type);
        if (bVar1) {
          this_local._4_4_ = EResSampler;
        }
        else {
          bVar1 = TDefaultIoResolverBase::isUboType(type);
          if (bVar1) {
            this_local._4_4_ = EResUbo;
          }
          else {
            this_local._4_4_ = EResCount;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

TResourceType getResourceType(const glslang::TType& type) override {
        if (isImageType(type)) {
            return EResImage;
        }
        if (isTextureType(type)) {
            return EResTexture;
        }
        if (isSsboType(type)) {
            return EResSsbo;
        }
        if (isSamplerType(type)) {
            return EResSampler;
        }
        if (isUboType(type)) {
            return EResUbo;
        }
        return EResCount;
    }